

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteAll(Fts3Table *p,int bContent)

{
  int in_ESI;
  sqlite3_value **in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int rc;
  
  sqlite3Fts3PendingTermsClear((Fts3Table *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  if (in_ESI != 0) {
    fts3SqlExec((int *)p,(Fts3Table *)CONCAT44(bContent,rc),unaff_retaddr_00,in_RDI);
  }
  fts3SqlExec((int *)p,(Fts3Table *)CONCAT44(bContent,rc),unaff_retaddr_00,in_RDI);
  fts3SqlExec((int *)p,(Fts3Table *)CONCAT44(bContent,rc),unaff_retaddr_00,in_RDI);
  if (*(char *)((long)in_RDI + 0x1be) != '\0') {
    fts3SqlExec((int *)p,(Fts3Table *)CONCAT44(bContent,rc),unaff_retaddr_00,in_RDI);
  }
  if (*(char *)((long)in_RDI + 0x1bd) != '\0') {
    fts3SqlExec((int *)p,(Fts3Table *)CONCAT44(bContent,rc),unaff_retaddr_00,in_RDI);
  }
  return 0;
}

Assistant:

static int fts3DeleteAll(Fts3Table *p, int bContent){
  int rc = SQLITE_OK;             /* Return code */

  /* Discard the contents of the pending-terms hash table. */
  sqlite3Fts3PendingTermsClear(p);

  /* Delete everything from the shadow tables. Except, leave %_content as
  ** is if bContent is false.  */
  assert( p->zContentTbl==0 || bContent==0 );
  if( bContent ) fts3SqlExec(&rc, p, SQL_DELETE_ALL_CONTENT, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGMENTS, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGDIR, 0);
  if( p->bHasDocsize ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_DOCSIZE, 0);
  }
  if( p->bHasStat ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_STAT, 0);
  }
  return rc;
}